

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O3

iterator __thiscall
cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push_impl
          (cmLinkedTree<cmStateDetail::PolicyStackEntry> *this,iterator it,PolicyStackEntry *t)

{
  pointer *ppPVar1;
  iterator __position;
  iterator __position_00;
  ulong uVar2;
  long lVar3;
  byte bVar4;
  iterator iVar5;
  ulong local_18;
  
  local_18 = it.Position;
  bVar4 = 0;
  __position_00._M_current =
       (this->Data).
       super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  __position._M_current =
       (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_finish;
  uVar2 = (long)__position._M_current -
          (long)(this->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (uVar2 != ((long)__position_00._M_current -
                (long)(this->Data).
                      super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7) {
    __assert_fail("this->UpPositions.size() == this->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmLinkedTree.h"
                  ,0xb4,
                  "iterator cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push_impl(iterator, T &&) [T = cmStateDetail::PolicyStackEntry]"
                 );
  }
  if (local_18 <= uVar2) {
    if (__position._M_current ==
        (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->UpPositions,
                 __position,&local_18);
      __position_00._M_current =
           (this->Data).
           super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *__position._M_current = local_18;
      (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    if (__position_00._M_current ==
        (this->Data).
        super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
      ::_M_realloc_insert<cmStateDetail::PolicyStackEntry>(&this->Data,__position_00,t);
    }
    else {
      for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
        ((__position_00._M_current)->super_PolicyMap).Status.super__Base_bitset<8UL>._M_w[0] =
             (t->super_PolicyMap).Status.super__Base_bitset<8UL>._M_w[0];
        t = (PolicyStackEntry *)((long)t + (ulong)bVar4 * -0x10 + 8);
        __position_00._M_current = __position_00._M_current + (ulong)bVar4 * -0x10 + 8;
      }
      ppPVar1 = &(this->Data).
                 super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    iVar5.Position =
         (long)(this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    iVar5.Tree = this;
    return iVar5;
  }
  __assert_fail("it.Position <= this->UpPositions.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmLinkedTree.h"
                ,0xb5,
                "iterator cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push_impl(iterator, T &&) [T = cmStateDetail::PolicyStackEntry]"
               );
}

Assistant:

iterator Push_impl(iterator it, T&& t)
  {
    assert(this->UpPositions.size() == this->Data.size());
    assert(it.Position <= this->UpPositions.size());
    this->UpPositions.push_back(it.Position);
    this->Data.push_back(std::move(t));
    return iterator(this, this->UpPositions.size());
  }